

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::BatchnormLayerParams::SharedCtor(BatchnormLayerParams *this)

{
  this->channels_ = 0;
  this->computemeanvar_ = false;
  this->instancenormalization_ = false;
  *(undefined2 *)&this->field_0x3a = 0;
  this->epsilon_ = 0.0;
  this->mean_ = (WeightParams *)0x0;
  this->variance_ = (WeightParams *)0x0;
  this->gamma_ = (WeightParams *)0x0;
  this->beta_ = (WeightParams *)0x0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void BatchnormLayerParams::SharedCtor() {
  ::memset(&gamma_, 0, reinterpret_cast<char*>(&epsilon_) -
    reinterpret_cast<char*>(&gamma_) + sizeof(epsilon_));
  _cached_size_ = 0;
}